

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dots_reporter.h
# Opt level: O3

void __thiscall bandit::detail::dots_reporter::test_run_complete(dots_reporter *this)

{
  uint specs_succeeded;
  char cVar1;
  size_t __n;
  void *__buf;
  test_run_summary summary;
  
  cVar1 = (char)this->stm_;
  std::ios::widen((char)*(undefined8 *)(*(long *)this->stm_ + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  specs_succeeded = (this->super_progress_reporter).specs_succeeded_;
  __n = (size_t)specs_succeeded;
  test_run_summary::test_run_summary
            (&summary,(this->super_progress_reporter).specs_run_,
             (this->super_progress_reporter).specs_failed_,specs_succeeded,
             (this->super_progress_reporter).specs_skipped_,
             &(this->super_progress_reporter).failures_,
             &(this->super_progress_reporter).test_run_errors_,this->colorizer_);
  test_run_summary::write(&summary,(int)this->stm_,__buf,__n);
  std::ostream::flush();
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&summary.test_run_errors_.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&summary.failures_.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  return;
}

Assistant:

void test_run_complete() 
    {
      progress_reporter::test_run_complete();

      stm_ << std::endl;

      test_run_summary summary(specs_run_, specs_failed_, specs_succeeded_, specs_skipped_, failures_, 
          test_run_errors_, colorizer_);
      summary.write(stm_);
      stm_.flush();
    }